

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCE.h
# Opt level: O2

void __thiscall
BGIP_SolverCE::UpdateCEProbDistribution
          (BGIP_SolverCE *this,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *Xi,list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *best_samples)

{
  int *piVar1;
  double dVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  long *plVar5;
  element_type *peVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  size_type __n;
  size_type __n_00;
  ulong uVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  _Self __tmp;
  _List_node_base *p_Var14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong __n_01;
  undefined1 auVar20 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar21 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 in_XMM2 [16];
  allocator_type local_c2;
  allocator_type local_c1;
  shared_ptr<JointPolicyPureVector> p_jpol;
  shared_count local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  counts;
  
  uVar9 = ((long)(Xi->
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(Xi->
                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  sVar4 = (best_samples->super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>).
          _M_impl._M_node._M_size;
  counts.
  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  counts.
  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  counts.
  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var14 = (best_samples->super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  for (uVar16 = 0; uVar16 < uVar9; uVar16 = (ulong)((int)uVar16 + 1)) {
    p_jpol.px = *(element_type **)
                 &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8
    ;
    p_jpol.pn.pi_ =
         *(sp_counted_base **)
          &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
    if (p_jpol.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (p_jpol.pn.pi_)->use_count_ = (p_jpol.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    __n = (**(code **)(*(long *)p_jpol.px + 0x28))(p_jpol.px,uVar16,0,999999);
    boost::detail::shared_count::~shared_count(&p_jpol.pn);
    plVar5 = *(long **)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                        field_0x8;
    local_78.pi_ = *(sp_counted_base **)
                    &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                     field_0x10;
    if (local_78.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_78.pi_)->use_count_ = (local_78.pi_)->use_count_ + 1;
      UNLOCK();
    }
    __n_00 = (**(code **)(*plVar5 + 0x20))(plVar5,uVar16);
    in_ZMM1._8_56_ = extraout_var;
    in_ZMM1._0_8_ = extraout_XMM1_Qa;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,__n_00,&local_c1);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&p_jpol,__n,(value_type *)&local_70,&local_c2);
    std::
    vector<std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
    ::
    emplace_back<std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
              ((vector<std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
                *)&counts,
               (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)&p_jpol);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&p_jpol);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
    boost::detail::shared_count::~shared_count(&local_78);
  }
  while (p_Var14 != (_List_node_base *)best_samples) {
    peVar6 = (element_type *)p_Var14[1]._M_next[1]._M_next;
    p_jpol.pn.pi_ = *(sp_counted_base **)((long)(p_Var14[1]._M_next + 1) + 8);
    if (p_jpol.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (p_jpol.pn.pi_)->use_count_ = (p_jpol.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    p_jpol.px = peVar6;
    for (uVar15 = 0; uVar16 = (ulong)uVar15, uVar16 < uVar9; uVar15 = uVar15 + 1) {
      uVar17 = 0;
      while( true ) {
        local_70._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8;
        local_70._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
        if (local_70._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          local_70._M_impl.super__Vector_impl_data._M_finish[2] =
               local_70._M_impl.super__Vector_impl_data._M_finish[2] + 1;
          UNLOCK();
        }
        uVar10 = (**(code **)(*(long *)local_70._M_impl.super__Vector_impl_data._M_start + 0x28))
                           (local_70._M_impl.super__Vector_impl_data._M_start,uVar16,0,999999);
        in_ZMM1._8_56_ = extraout_var_00;
        in_ZMM1._0_8_ = extraout_XMM1_Qa_00;
        uVar18 = (ulong)uVar17;
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&local_70._M_impl.super__Vector_impl_data._M_finish);
        if (uVar10 <= uVar18) break;
        plVar5 = *(long **)(*(long *)(peVar6 + 0x68) + uVar16 * 8);
        uVar19 = (**(code **)(*plVar5 + 0x40))(plVar5,uVar18);
        uVar17 = uVar17 + 1;
        piVar1 = (int *)(*(long *)&counts.
                                   super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data + (ulong)uVar19 * 4);
        *piVar1 = *piVar1 + 1;
      }
    }
    p_Var14 = (((_List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)&p_Var14->_M_next)
              ->_M_impl)._M_node.super__List_node_base._M_next;
    boost::detail::shared_count::~shared_count(&p_jpol.pn);
  }
  auVar8 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,sVar4);
  for (uVar15 = 0; uVar16 = (ulong)uVar15, uVar16 < uVar9; uVar15 = uVar15 + 1) {
    uVar17 = 0;
    while( true ) {
      p_jpol.px = *(element_type **)
                   &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                    field_0x8;
      p_jpol.pn.pi_ =
           *(sp_counted_base **)
            &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
      if (p_jpol.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (p_jpol.pn.pi_)->use_count_ = (p_jpol.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      uVar10 = (**(code **)(*(long *)p_jpol.px + 0x28))(p_jpol.px,uVar15,0,999999);
      uVar18 = (ulong)uVar17;
      boost::detail::shared_count::~shared_count(&p_jpol.pn);
      if (uVar10 <= uVar18) break;
      uVar19 = 0;
      while( true ) {
        p_jpol.px = *(element_type **)
                     &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                      field_0x8;
        p_jpol.pn.pi_ =
             *(sp_counted_base **)
              &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
        if (p_jpol.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (p_jpol.pn.pi_)->use_count_ = (p_jpol.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        uVar10 = (**(code **)(*(long *)p_jpol.px + 0x20))(p_jpol.px,uVar15);
        __n_01 = (ulong)uVar19;
        boost::detail::shared_count::~shared_count(&p_jpol.pn);
        if (uVar10 <= __n_01) break;
        auVar7 = vcvtusi2sd_avx512f(in_XMM2,*(undefined4 *)
                                             (*(long *)&counts.
                                                  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + __n_01 * 4));
        dVar2 = this->_m_alpha;
        pvVar11 = std::
                  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  ::at(Xi,uVar16);
        pvVar12 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::at(pvVar11,uVar18);
        pvVar13 = std::vector<double,_std::allocator<double>_>::at(pvVar12,__n_01);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = 1.0 - dVar2;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *pvVar13;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = (auVar7._0_8_ / auVar8._0_8_) * this->_m_alpha;
        auVar3 = vfmadd231sd_fma(auVar21,auVar20,auVar3);
        pvVar11 = std::
                  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  ::at(Xi,uVar16);
        pvVar12 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::at(pvVar11,uVar18);
        pvVar13 = std::vector<double,_std::allocator<double>_>::at(pvVar12,__n_01);
        uVar19 = uVar19 + 1;
        *pvVar13 = auVar3._0_8_;
      }
      uVar17 = uVar17 + 1;
    }
  }
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::~vector(&counts);
  return;
}

Assistant:

void UpdateCEProbDistribution(
        std::vector< std::vector< std::vector<double> > >& Xi, 
        const std::list<JPPVValuePair* >& best_samples)
        {
            size_t nrAgents = Xi.size();
            size_t nrSamples = best_samples.size();
            //get counts
            std::vector< std::vector< std::vector< unsigned int > > > counts;
            std::list<JPPVValuePair* >::const_iterator it = best_samples.begin();
            std::list<JPPVValuePair* >::const_iterator last = best_samples.end();
            for(Index agI=0; agI < nrAgents; agI++)    
            {
                size_t nrT =  this->GetBGIPI()->
                    GetNrPolicyDomainElements(agI, TYPE_INDEX);
                counts.push_back( 
                    std::vector< std::vector< unsigned int > >( 
                        nrT, 
                        std::vector<  unsigned int >(this->GetBGIPI()->GetNrActions(agI))
                        )
                    );
            }
            
            while(it != last)
            {
                boost::shared_ptr<JointPolicyPureVector> p_jpol= (*it)->GetJPPV();
                std::vector< PolicyPureVector* > & policies = 
                    p_jpol->GetIndividualPolicies();
                for(Index agI=0; agI < nrAgents; agI++)
                {
                    for(Index typeI=0; typeI < this->GetBGIPI()->
                            GetNrPolicyDomainElements(agI, TYPE_INDEX); typeI++)
                    {
                        Index acI = policies[agI]->GetActionIndex(typeI);
                        counts[agI][typeI][acI]++;
                    }
                }
                it++;
            }
            // update
    
            for(Index agI=0; agI < nrAgents; agI++)
                for(Index typeI=0; typeI < this->GetBGIPI()->
                        GetNrPolicyDomainElements(agI, TYPE_INDEX); typeI++)
                    for(Index acI=0; acI < this->GetBGIPI()->GetNrActions(agI); acI++)
                    {
                        double new_prob = ((double)counts[agI][typeI][acI])/nrSamples;
                        Xi.at(agI).at(typeI).at(acI) = 
                            (1 - _m_alpha)  * Xi.at(agI).at(typeI).at(acI) +
                            _m_alpha * new_prob;
                    }
        }